

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_states.cpp
# Opt level: O0

FName CheckCastKludges(FName *in)

{
  int iVar1;
  FName *in_RSI;
  FName *in_local;
  
  iVar1 = FName::operator_cast_to_int(in_RSI);
  switch(iVar1) {
  case 0x22c:
    FName::FName(in,NAME___decorate_internal_int__);
    break;
  default:
    FName::FName(in,in_RSI);
    break;
  case 0x22e:
    FName::FName(in,NAME___decorate_internal_bool__);
    break;
  case 0x22f:
    FName::FName(in,NAME___decorate_internal_float__);
    break;
  case 0x238:
    FName::FName(in,NAME___decorate_internal_state__);
  }
  return (FName)(int)in;
}

Assistant:

FName CheckCastKludges(FName in)
{
	switch (in)
	{
	case NAME_Int:
		return NAME___decorate_internal_int__;
	case NAME_Bool:
		return NAME___decorate_internal_bool__;
	case NAME_State:
		return NAME___decorate_internal_state__;
	case NAME_Float:
		return NAME___decorate_internal_float__;
	default:
		return in;
	}
}